

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O1

bool __thiscall DepsLog::Recompact(DepsLog *this,string *path,string *err)

{
  pointer pcVar1;
  pointer ppNVar2;
  Deps *pDVar3;
  char *pcVar4;
  pointer ppDVar5;
  pointer ppDVar6;
  pointer ppNVar7;
  Metrics *this_00;
  string *psVar8;
  bool bVar9;
  int iVar10;
  pointer ppNVar11;
  pointer ppDVar12;
  int *piVar13;
  char *__s;
  Metric *pMVar14;
  long lVar15;
  DepsLog *this_01;
  string temp_path;
  ScopedMetric metrics_h_scoped;
  DepsLog new_log;
  string local_e8;
  string *local_c8;
  string local_c0;
  ScopedMetric local_a0;
  DepsLog local_90;
  
  if ((Recompact(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar10 = __cxa_guard_acquire(&Recompact(std::__cxx11::string_const&,std::__cxx11::string*)::
                                    metrics_h_metric), this_00 = g_metrics, iVar10 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar14 = (Metric *)0x0;
    }
    else {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,".ninja_deps recompact","");
      pMVar14 = Metrics::NewMetric(this_00,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    Recompact::metrics_h_metric = pMVar14;
    __cxa_guard_release(&Recompact(std::__cxx11::string_const&,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_a0,Recompact::metrics_h_metric);
  Close(this);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar1,pcVar1 + path->_M_string_length);
  std::__cxx11::string::append((char *)&local_e8);
  unlink(local_e8._M_dataplus._M_p);
  local_90.file_path_._M_dataplus._M_p = (pointer)&local_90.file_path_.field_2;
  local_90.needs_recompaction_ = false;
  local_90.file_ = (FILE *)0x0;
  local_90.file_path_._M_string_length = 0;
  local_90.file_path_.field_2._M_local_buf[0] = '\0';
  local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = &local_90;
  bVar9 = OpenForWrite(this_01,&local_e8,err);
  if (bVar9) {
    ppNVar2 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppNVar11 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppNVar11 != ppNVar2; ppNVar11 = ppNVar11 + 1)
    {
      (*ppNVar11)->id_ = -1;
    }
    ppDVar12 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_c8 = err;
    if (0 < (int)((ulong)((long)(this->deps_).
                                super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar12) >> 3))
    {
      lVar15 = 0;
      do {
        pDVar3 = ppDVar12[lVar15];
        iVar10 = 7;
        if ((pDVar3 != (Deps *)0x0) &&
           (bVar9 = IsDepsEntryLiveFor(this_01,(this->nodes_).
                                               super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                               _M_impl.super__Vector_impl_data._M_start[lVar15]),
           bVar9)) {
          this_01 = &local_90;
          bVar9 = RecordDeps(&local_90,
                             (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar15],pDVar3->mtime,
                             pDVar3->node_count,pDVar3->nodes);
          iVar10 = 0;
          if (!bVar9) {
            iVar10 = 1;
            this_01 = &local_90;
            Close(&local_90);
          }
        }
        if ((iVar10 != 7) && (iVar10 != 0)) {
          bVar9 = false;
          goto LAB_00111204;
        }
        lVar15 = lVar15 + 1;
        ppDVar12 = (this->deps_).
                   super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      } while (lVar15 < (int)((ulong)((long)(this->deps_).
                                            super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppDVar12) >> 3));
    }
    Close(&local_90);
    psVar8 = local_c8;
    ppDVar5 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppDVar6 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppDVar12 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    ppNVar2 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppNVar7 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppNVar11 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppNVar2;
    local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar7;
    local_90.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppNVar11;
    local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppDVar5;
    local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppDVar6;
    local_90.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppDVar12;
    iVar10 = unlink((path->_M_dataplus)._M_p);
    if (-1 < iVar10) {
      iVar10 = rename(local_e8._M_dataplus._M_p,(path->_M_dataplus)._M_p);
      bVar9 = true;
      if (-1 < iVar10) goto LAB_00111204;
    }
    piVar13 = __errno_location();
    __s = strerror(*piVar13);
    pcVar4 = (char *)psVar8->_M_string_length;
    strlen(__s);
    bVar9 = false;
    std::__cxx11::string::_M_replace((ulong)psVar8,0,pcVar4,(ulong)__s);
  }
  else {
    bVar9 = false;
  }
LAB_00111204:
  ~DepsLog(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  ScopedMetric::~ScopedMetric(&local_a0);
  return bVar9;
}

Assistant:

bool DepsLog::Recompact(const string& path, string* err) {
  METRIC_RECORD(".ninja_deps recompact");

  Close();
  string temp_path = path + ".recompact";

  // OpenForWrite() opens for append.  Make sure it's not appending to a
  // left-over file from a previous recompaction attempt that crashed somehow.
  unlink(temp_path.c_str());

  DepsLog new_log;
  if (!new_log.OpenForWrite(temp_path, err))
    return false;

  // Clear all known ids so that new ones can be reassigned.  The new indices
  // will refer to the ordering in new_log, not in the current log.
  for (vector<Node*>::iterator i = nodes_.begin(); i != nodes_.end(); ++i)
    (*i)->set_id(-1);

  // Write out all deps again.
  for (int old_id = 0; old_id < (int)deps_.size(); ++old_id) {
    Deps* deps = deps_[old_id];
    if (!deps) continue;  // If nodes_[old_id] is a leaf, it has no deps.

    if (!IsDepsEntryLiveFor(nodes_[old_id]))
      continue;

    if (!new_log.RecordDeps(nodes_[old_id], deps->mtime,
                            deps->node_count, deps->nodes)) {
      new_log.Close();
      return false;
    }
  }

  new_log.Close();

  // All nodes now have ids that refer to new_log, so steal its data.
  deps_.swap(new_log.deps_);
  nodes_.swap(new_log.nodes_);

  if (unlink(path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}